

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

DayPeriodRules * icu_63::DayPeriodRules::getInstance(Locale *locale,UErrorCode *errorCode)

{
  char cVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  char name [157];
  char parentName [157];
  char local_168 [160];
  char local_c8 [168];
  
  umtx_initOnce((UInitOnce *)&(anonymous_namespace)::initOnce,load,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    __s = Locale::getBaseName(locale);
    sVar3 = strlen(__s);
    if (sVar3 < 0x9d) {
      strcpy(local_168,__s);
      if (local_168[0] == '\0') {
        builtin_strncpy(local_168,"root",5);
      }
      cVar1 = '\x01';
      while( true ) {
        if (cVar1 == '\0') {
          return (DayPeriodRules *)0x0;
        }
        uVar2 = uhash_geti_63((UHashtable *)*(anonymous_namespace)::data,local_168);
        if (uVar2 != 0) break;
        uloc_getParent_63(local_168,local_c8,0x9d,errorCode);
        if (local_c8[0] == '\0') {
          return (DayPeriodRules *)0x0;
        }
        strcpy(local_168,local_c8);
        cVar1 = local_168[0];
      }
      if (0 < (int)uVar2) {
        if (*(int *)((anonymous_namespace)::data[1] + 4 + (ulong)uVar2 * 100) == -1) {
          return (DayPeriodRules *)0x0;
        }
        return (DayPeriodRules *)((anonymous_namespace)::data[1] + (ulong)uVar2 * 100);
      }
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return (DayPeriodRules *)0x0;
}

Assistant:

const DayPeriodRules *DayPeriodRules::getInstance(const Locale &locale, UErrorCode &errorCode) {
    umtx_initOnce(initOnce, DayPeriodRules::load, errorCode);

    // If the entire day period rules data doesn't conform to spec (even if the part we want
    // does), return NULL.
    if(U_FAILURE(errorCode)) { return NULL; }

    const char *localeCode = locale.getBaseName();
    char name[ULOC_FULLNAME_CAPACITY];
    char parentName[ULOC_FULLNAME_CAPACITY];

    if (uprv_strlen(localeCode) < ULOC_FULLNAME_CAPACITY) {
        uprv_strcpy(name, localeCode);

        // Treat empty string as root.
        if (*name == '\0') {
            uprv_strcpy(name, "root");
        }
    } else {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return NULL;
    }

    int32_t ruleSetNum = 0;  // NB there is no rule set 0 and 0 is returned upon lookup failure.
    while (*name != '\0') {
        ruleSetNum = uhash_geti(data->localeToRuleSetNumMap, name);
        if (ruleSetNum == 0) {
            // name and parentName can't be the same pointer, so fill in parent then copy to child.
            uloc_getParent(name, parentName, ULOC_FULLNAME_CAPACITY, &errorCode);
            if (*parentName == '\0') {
                // Saves a lookup in the hash table.
                break;
            }
            uprv_strcpy(name, parentName);
        } else {
            break;
        }
    }

    if (ruleSetNum <= 0 || data->rules[ruleSetNum].getDayPeriodForHour(0) == DAYPERIOD_UNKNOWN) {
        // If day period for hour 0 is UNKNOWN then day period for all hours are UNKNOWN.
        // Data doesn't exist even with fallback.
        return NULL;
    } else {
        return &data->rules[ruleSetNum];
    }
}